

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigJust.c
# Opt level: O1

int Aig_ObjTerSimulate(Aig_Man_t *pAig,Aig_Obj_t *pNode,Vec_Int_t *vSuppLits)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  
  Aig_ManIncrementTravId(pAig);
  if (0 < vSuppLits->nSize) {
    lVar4 = 0;
    do {
      uVar1 = vSuppLits->pArray[lVar4];
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      if (pAig->vCis->nSize <= (int)(uVar1 >> 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAig->vCis->pArray[uVar1 >> 1];
      *(ulong *)((long)pvVar2 + 0x18) =
           (*(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffcf) + (ulong)((uVar1 & 1) == 0) * 0x10
           + 0x10;
      *(int *)((long)pvVar2 + 0x20) = pAig->nTravIds;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vSuppLits->nSize);
  }
  iVar3 = Aig_ObjTerSimulate_rec(pAig,pNode);
  return iVar3;
}

Assistant:

int Aig_ObjTerSimulate( Aig_Man_t * pAig, Aig_Obj_t * pNode, Vec_Int_t * vSuppLits )
{
    Aig_Obj_t * pObj;
    int i, Entry;
    Aig_ManIncrementTravId( pAig );
    Vec_IntForEachEntry( vSuppLits, Entry, i )
    {
        pObj = Aig_ManCi( pAig, Abc_Lit2Var(Entry) );
        Aig_ObjSetTerValue( pObj, Abc_LitIsCompl(Entry) ? AIG_VAL0 : AIG_VAL1 );
        Aig_ObjSetTravIdCurrent( pAig, pObj );
//printf( "%d ", Entry );
    }
//printf( "\n" );
    return Aig_ObjTerSimulate_rec( pAig, pNode );
}